

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_float.c
# Opt level: O0

vf_profile_t *
vf_profile_custom(vf_profile_t *__return_storage_ptr__,uint16_t bits,uint16_t exp,vf_base_t bias)

{
  char cVar1;
  byte bVar2;
  vf_base_t bias_local;
  uint16_t exp_local;
  uint16_t bits_local;
  
  if (bits < 8) {
    __assert_fail("bits >= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0x1a,
                  "vf_profile_t vf_profile_custom(const uint16_t, const uint16_t, const vf_base_t)")
    ;
  }
  if (exp == 0) {
    __assert_fail("exp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0x1b,
                  "vf_profile_t vf_profile_custom(const uint16_t, const uint16_t, const vf_base_t)")
    ;
  }
  if ((int)(bits - 2) <= (int)(uint)exp) {
    __assert_fail("exp < (bits - 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0x1c,
                  "vf_profile_t vf_profile_custom(const uint16_t, const uint16_t, const vf_base_t)")
    ;
  }
  if (bias != 0) {
    bVar2 = (byte)exp;
    if (bias < (1L << (bVar2 & 0x3f)) - 1U) {
      cVar1 = (char)bits;
      __return_storage_ptr__->sgn_mask = 1L << (cVar1 - 1U & 0x3f);
      __return_storage_ptr__->exp_mask =
           (1L << (cVar1 - 1U & 0x3f)) - 1U &
           ((1L << ((cVar1 + -1) - bVar2 & 0x3f)) - 1U ^ 0xffffffffffffffff);
      __return_storage_ptr__->mnt_mask = (1L << ((cVar1 + -1) - bVar2 & 0x3f)) - 1;
      __return_storage_ptr__->bias = bias;
      __return_storage_ptr__->mask = 0xffffffffffffffff >> (0x40U - cVar1 & 0x3f);
      __return_storage_ptr__->bits = bits;
      __return_storage_ptr__->sgn_bits = 1;
      __return_storage_ptr__->exp_bits = exp;
      __return_storage_ptr__->mnt_bits = (bits - 1) - exp;
      return __return_storage_ptr__;
    }
    __assert_fail("bias < ((vf_base_t)1 << exp) - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0x1e,
                  "vf_profile_t vf_profile_custom(const uint16_t, const uint16_t, const vf_base_t)")
    ;
  }
  __assert_fail("bias > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                ,0x1d,
                "vf_profile_t vf_profile_custom(const uint16_t, const uint16_t, const vf_base_t)");
}

Assistant:

vf_profile_t vf_profile_custom(const uint16_t bits, const uint16_t exp, const vf_base_t bias) {
	assert(bits >= 8);
	assert(exp > 0);
	assert(exp < (bits - 2));
	assert(bias > 0);
	assert(bias < ((vf_base_t)1 << exp) - 1);
	return (vf_profile_t){
		.bias = bias,
		.bits = bits,
		.mask = (~(vf_base_t)0) >> ((sizeof(vf_base_t) * CHAR_BIT) - bits),
		.sgn_bits = 1,
		.exp_bits = exp,
		.mnt_bits = (uint16_t)(bits - 1 - exp),
		.sgn_mask = (vf_base_t)1 << (bits - 1),
		.exp_mask = (((vf_base_t)1 << (bits - 1)) - 1) & ~(((vf_base_t)1 << (bits - 1 - exp)) - 1),
		.mnt_mask = ((vf_base_t)1 << (bits - 1 - exp)) - 1
	};
}